

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opt_dead_builtin_varyings.cpp
# Opt level: O0

ir_visitor_status __thiscall
anon_unknown.dwarf_11f0f1::varying_info_visitor::visit_enter
          (varying_info_visitor *this,ir_dereference_array *ir)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  ir_constant *piVar5;
  ir_constant *index_1;
  ir_constant *index;
  ir_variable *var;
  ir_dereference_array *ir_local;
  varying_info_visitor *this_local;
  ir_variable *piVar4;
  
  iVar2 = (*(ir->super_ir_dereference).super_ir_rvalue.super_ir_instruction._vptr_ir_instruction[8])
                    ();
  piVar4 = (ir_variable *)CONCAT44(extraout_var,iVar2);
  if ((((piVar4 == (ir_variable *)0x0) ||
       ((*(uint *)&piVar4->data >> 0xc & (ir_var_mode_count|ir_var_shader_shared)) != this->mode))
      || (bVar1 = glsl_type::is_array(piVar4->type), !bVar1)) ||
     (bVar1 = is_gl_identifier(piVar4->name), !bVar1)) {
    this_local._4_4_ = visit_continue;
  }
  else if (((this->find_frag_outputs & 1U) == 0) ||
          (iVar2 = strcmp(piVar4->name,"gl_FragData"), iVar2 != 0)) {
    if (((this->find_frag_outputs & 1U) == 0) && ((piVar4->data).location == 4)) {
      this->texcoord_array = piVar4;
      piVar5 = ir_instruction::as_constant(&ir->array_index->super_ir_instruction);
      if (piVar5 == (ir_constant *)0x0) {
        iVar2 = glsl_type::array_size(piVar4->type);
        this->texcoord_usage = (1 << ((byte)iVar2 & 0x1f)) - 1U | this->texcoord_usage;
        (this->super_ir_hierarchical_visitor).field_0x31 = 0;
      }
      else {
        uVar3 = ir_constant::get_uint_component(piVar5,0);
        this->texcoord_usage = 1 << ((byte)uVar3 & 0x1f) | this->texcoord_usage;
      }
      this_local._4_4_ = visit_continue_with_parent;
    }
    else {
      this_local._4_4_ = visit_continue;
    }
  }
  else {
    this->fragdata_array = piVar4;
    piVar5 = ir_instruction::as_constant(&ir->array_index->super_ir_instruction);
    if (piVar5 == (ir_constant *)0x0) {
      iVar2 = glsl_type::array_size(piVar4->type);
      this->fragdata_usage = (1 << ((byte)iVar2 & 0x1f)) - 1U | this->fragdata_usage;
      this->lower_fragdata_array = false;
    }
    else {
      uVar3 = ir_constant::get_uint_component(piVar5,0);
      this->fragdata_usage = 1 << ((byte)uVar3 & 0x1f) | this->fragdata_usage;
      if (((piVar4->type->gl_type != 0x1406) && (piVar4->type->gl_type != 0x8b50)) &&
         ((piVar4->type->gl_type != 0x8b51 && (piVar4->type->gl_type != 0x8b52)))) {
        this->lower_fragdata_array = false;
      }
    }
    this_local._4_4_ = visit_continue_with_parent;
  }
  return this_local._4_4_;
}

Assistant:

virtual ir_visitor_status visit_enter(ir_dereference_array *ir)
   {
      ir_variable *var = ir->variable_referenced();

      if (!var || var->data.mode != this->mode || !var->type->is_array() ||
          !is_gl_identifier(var->name))
         return visit_continue;

      /* Only match gl_FragData[], not gl_SecondaryFragDataEXT[] or
       * gl_LastFragData[].
       */
      if (this->find_frag_outputs && strcmp(var->name, "gl_FragData") == 0) {
         this->fragdata_array = var;

         ir_constant *index = ir->array_index->as_constant();
         if (index == NULL) {
            /* This is variable indexing. */
            this->fragdata_usage |= (1 << var->type->array_size()) - 1;
            this->lower_fragdata_array = false;
         }
         else {
            this->fragdata_usage |= 1 << index->get_uint_component(0);
            /* Don't lower fragdata array if the output variable
             * is not a float variable (or float vector) because it will
             * generate wrong register assignments because of different
             * data types.
             */
            if (var->type->gl_type != GL_FLOAT &&
                var->type->gl_type != GL_FLOAT_VEC2 &&
                var->type->gl_type != GL_FLOAT_VEC3 &&
                var->type->gl_type != GL_FLOAT_VEC4)
               this->lower_fragdata_array = false;
         }

         /* Don't visit the leaves of ir_dereference_array. */
         return visit_continue_with_parent;
      }

      if (!this->find_frag_outputs && var->data.location == VARYING_SLOT_TEX0) {
         this->texcoord_array = var;

         ir_constant *index = ir->array_index->as_constant();
         if (index == NULL) {
            /* There is variable indexing, we can't lower the texcoord array.
             */
            this->texcoord_usage |= (1 << var->type->array_size()) - 1;
            this->lower_texcoord_array = false;
         }
         else {
            this->texcoord_usage |= 1 << index->get_uint_component(0);
         }

         /* Don't visit the leaves of ir_dereference_array. */
         return visit_continue_with_parent;
      }

      return visit_continue;
   }